

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

void idle_cb(uv_idle_t *handle)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStackY_30;
  
  if (send_req.handle != (uv_udp_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
            ,0x2f,"send_req.handle","==","NULL",send_req.handle,"==",0);
    abort();
  }
  if (handle == &idle_handle) {
    iVar1 = uv_idle_stop(&idle_handle);
    if (iVar1 == 0) {
      if (999 < loop_hang_called) {
        loop_hang_called = loop_hang_called + 1;
        uv_close(&client,0);
        uv_close(&idle_handle,0);
        return;
      }
      loop_hang_called = loop_hang_called + 1;
      iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
      if (iVar1 == 0) {
        return;
      }
      pcVar2 = "r == 0";
      uStackY_30 = 0x40;
    }
    else {
      pcVar2 = "0 == uv_idle_stop(handle)";
      uStackY_30 = 0x31;
    }
  }
  else {
    pcVar2 = "(uv_idle_t*)(handle) == &(idle_handle)";
    uStackY_30 = 0x30;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-hang-loop.c"
          ,uStackY_30,pcVar2);
  abort();
}

Assistant:

static void idle_cb(uv_idle_t* idle) {
  uv_sleep(100);
  if (++ticks < kMaxTicks)
    return;

  uv_poll_stop(&poll_req[0]);
  uv_poll_stop(&poll_req[1]);
  uv_close((uv_handle_t*) &server_handle, NULL);
  uv_close((uv_handle_t*) &client_handle, NULL);
  uv_close((uv_handle_t*) &peer_handle, NULL);
  uv_close((uv_handle_t*) idle, NULL);
}